

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

TPZManVector<TPZTensor<TFad<6,_double>_>,_3> * __thiscall
TPZManVector<TPZTensor<TFad<6,_double>_>,_3>::operator=
          (TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *this,
          TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *copy)

{
  double dVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  TPZTensor<TFad<6,_double>_> *pTVar4;
  ulong uVar5;
  ulong *puVar6;
  TPZTensor<TFad<6,_double>_> *pTVar7;
  TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *in_RSI;
  TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *in_RDI;
  ulong uVar8;
  int64_t i;
  int64_t nel;
  TPZTensor<TFad<6,_double>_> *in_stack_ffffffffffffff28;
  TPZTensor<TFad<6,_double>_> *in_stack_ffffffffffffff30;
  TPZTensor<TFad<6,_double>_> *local_b0;
  TPZTensor<TFad<6,_double>_> *in_stack_ffffffffffffff90;
  long local_30;
  
  if (in_RDI != in_RSI) {
    uVar3 = TPZVec<TPZTensor<TFad<6,_double>_>_>::NElements
                      (&in_RSI->super_TPZVec<TPZTensor<TFad<6,_double>_>_>);
    if ((((in_RDI->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc < (long)uVar3) &&
        ((in_RDI->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore !=
         (TPZTensor<TFad<6,_double>_> *)0x0)) &&
       ((in_RDI->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore != in_RDI->fExtAlloc)) {
      pTVar7 = (in_RDI->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore;
      if (pTVar7 != (TPZTensor<TFad<6,_double>_> *)0x0) {
        dVar1 = pTVar7[-1].fData.fExtAlloc[5].dx_[5];
        for (pTVar4 = pTVar7 + (long)dVar1; pTVar7 != pTVar4; pTVar4 = pTVar4 + -1) {
          TPZTensor<TFad<6,_double>_>::~TPZTensor((TPZTensor<TFad<6,_double>_> *)0x14b03e4);
        }
        operator_delete__(pTVar7[-1].fData.fExtAlloc[5].dx_ + 5,(long)dVar1 * 0x1a8 + 8);
      }
      (in_RDI->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore =
           (TPZTensor<TFad<6,_double>_> *)0x0;
      (in_RDI->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = 0;
    }
    if ((long)uVar3 < 4) {
      if (((in_RDI->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore != in_RDI->fExtAlloc) &&
         (pTVar7 = (in_RDI->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore,
         pTVar7 != (TPZTensor<TFad<6,_double>_> *)0x0)) {
        dVar1 = pTVar7[-1].fData.fExtAlloc[5].dx_[5];
        for (pTVar4 = pTVar7 + (long)dVar1; pTVar7 != pTVar4; pTVar4 = pTVar4 + -1) {
          TPZTensor<TFad<6,_double>_>::~TPZTensor((TPZTensor<TFad<6,_double>_> *)0x14b04bc);
        }
        operator_delete__(pTVar7[-1].fData.fExtAlloc[5].dx_ + 5,(long)dVar1 * 0x1a8 + 8);
      }
      (in_RDI->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = 0;
      (in_RDI->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore = in_RDI->fExtAlloc;
      (in_RDI->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements = uVar3;
    }
    else if ((in_RDI->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc < (long)uVar3) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar3;
      uVar5 = SUB168(auVar2 * ZEXT816(0x1a8),0);
      uVar8 = uVar5 + 8;
      if (SUB168(auVar2 * ZEXT816(0x1a8),8) != 0 || 0xfffffffffffffff7 < uVar5) {
        uVar8 = 0xffffffffffffffff;
      }
      puVar6 = (ulong *)operator_new__(uVar8);
      *puVar6 = uVar3;
      pTVar7 = (TPZTensor<TFad<6,_double>_> *)(puVar6 + 1);
      if (uVar3 != 0) {
        local_b0 = pTVar7;
        do {
          TPZTensor<TFad<6,_double>_>::TPZTensor(in_stack_ffffffffffffff90);
          local_b0 = local_b0 + 1;
        } while (local_b0 != pTVar7 + uVar3);
      }
      (in_RDI->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore = pTVar7;
      (in_RDI->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = uVar3;
      (in_RDI->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements = uVar3;
    }
    else {
      (in_RDI->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements = uVar3;
    }
    for (local_30 = 0; local_30 < (long)uVar3; local_30 = local_30 + 1) {
      TPZTensor<TFad<6,_double>_>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
  }
  return in_RDI;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}